

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddCryptedKey
          (DescriptorScriptPubKeyMan *this,CKeyID *key_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *crypted_key)

{
  long lVar1;
  bool bVar2;
  mapped_type *this_00;
  AnnotatedMixin<std::recursive_mutex> *in_RCX;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDX,in_RCX,(char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             SUB41((uint)in_stack_ffffffffffffff48 >> 0x18,0));
  bVar2 = std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::empty((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)in_stack_ffffffffffffff28);
  if (bVar2) {
    std::make_pair<CPubKey_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              ((CPubKey *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
    this_00 = std::
              map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              ::operator[](in_stack_ffffffffffffff50,
                           (key_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                          );
    std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
              (this_00,(type)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~pair
              (in_stack_ffffffffffffff28);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool DescriptorScriptPubKeyMan::AddCryptedKey(const CKeyID& key_id, const CPubKey& pubkey, const std::vector<unsigned char>& crypted_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    m_map_crypted_keys[key_id] = make_pair(pubkey, crypted_key);
    return true;
}